

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

void __thiscall Omega_h::Write<double>::Write(Write<double> *this,LO size_in,string *name_in)

{
  int *piVar1;
  double dVar2;
  Alloc *this_00;
  long lVar3;
  long lVar4;
  long *plVar5;
  Now b;
  Real RVar6;
  SharedAlloc local_28;
  
  (this->shared_alloc_).alloc = (Alloc *)0x0;
  (this->shared_alloc_).direct_ptr = (void *)0x0;
  begin_code("Write allocation",(char *)0x0);
  SharedAlloc::SharedAlloc(&local_28,(long)size_in << 3,name_in);
  this_00 = (this->shared_alloc_).alloc;
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  (this->shared_alloc_).alloc = local_28.alloc;
  (this->shared_alloc_).direct_ptr = local_28.direct_ptr;
  if ((((ulong)local_28.alloc & 7) == 0 && local_28.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_28.alloc)->use_count = (local_28.alloc)->use_count + -1;
    (this->shared_alloc_).alloc = (Alloc *)((local_28.alloc)->size * 8 + 1);
  }
  plVar5 = profile::global_singleton_history;
  if (profile::global_singleton_history != (long *)0x0) {
    dVar2 = *(double *)
             (*profile::global_singleton_history + 0x30 +
             profile::global_singleton_history[3] * 0x40);
    b = now();
    RVar6 = operator-(b,(Impl)((Impl *)(*plVar5 + 0x28 + plVar5[3] * 0x40))->__d);
    lVar3 = *plVar5;
    lVar4 = plVar5[3];
    *(double *)(lVar3 + 0x30 + lVar4 * 0x40) = dVar2 + RVar6;
    plVar5[3] = *(long *)(lVar3 + lVar4 * 0x40);
  }
  return;
}

Assistant:

Write<T>::Write(LO size_in, std::string const& name_in) {
  begin_code("Write allocation");
#ifdef OMEGA_H_USE_KOKKOS
  view_ = decltype(view_)(Kokkos::ViewAllocateWithoutInitializing(name_in),
      static_cast<std::size_t>(size_in));
#else
  shared_alloc_ = decltype(shared_alloc_)(
      sizeof(T) * static_cast<std::size_t>(size_in), name_in);
#endif
  end_code();
}